

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WaveletTree.h
# Opt level: O0

ulint __thiscall
bwtil::WaveletTree::recursiveRank(WaveletTree *this,uchar c,ulint i,ulint node,uint level)

{
  byte bVar1;
  uint uVar2;
  uint level_00;
  reference this_00;
  ulint uVar3;
  succinct_bitvector *in_RCX;
  undefined8 in_RDX;
  uchar in_SIL;
  succinct_bitvector *in_RDI;
  uint in_R8D;
  uint rank;
  uint bit;
  ulint in_stack_ffffffffffffffb8;
  uchar c_00;
  undefined7 in_stack_ffffffffffffffe8;
  ulong local_8;
  
  c_00 = (uchar)((ulong)in_RDX >> 0x38);
  this_00 = std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::
            operator[]((vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
                        *)&in_RDI->bitvector,(size_type)in_RCX);
  uVar3 = succinct_bitvector::length(this_00);
  if (uVar3 == 0) {
    local_8 = 0;
  }
  else {
    bVar1 = bitInChar((WaveletTree *)in_RDI,in_SIL,in_R8D);
    uVar2 = (uint)bVar1;
    if (uVar2 == 0) {
      std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::operator[]
                ((vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> *)
                 &in_RDI->bitvector,(size_type)in_RCX);
      uVar3 = succinct_bitvector::rank0(in_RDI,in_stack_ffffffffffffffb8);
      level_00 = (uint)uVar3;
    }
    else {
      std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::operator[]
                ((vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> *)
                 &in_RDI->bitvector,(size_type)in_RCX);
      uVar3 = succinct_bitvector::rank1(in_RCX,CONCAT44(in_R8D,uVar2));
      level_00 = (uint)uVar3;
    }
    if (in_R8D == *(int *)((long)&(in_RDI->rank_ptrs_1).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 4) - 1U) {
      local_8 = (ulong)level_00;
    }
    else {
      if (uVar2 == 0) {
        child0((WaveletTree *)in_RDI,(ulint)in_RCX);
      }
      else {
        child1((WaveletTree *)in_RDI,(ulint)in_RCX);
      }
      local_8 = recursiveRank((WaveletTree *)CONCAT17(in_SIL,in_stack_ffffffffffffffe8),c_00,
                              (ulint)in_RCX,CONCAT44(in_R8D,uVar2),level_00);
    }
  }
  return local_8;
}

Assistant:

ulint recursiveRank(uchar c, ulint i, ulint node, uint level){//number of characters 'c' before position i excluded

		if(nodes[node].length()==0)//empty node
			return 0;

		uint bit = bitInChar(c,level);
		uint rank;

		if(bit==0)
			rank = nodes[node].rank0(i);
		else
			rank = nodes[node].rank1(i);

		if(level==log_sigma-1)//leaf
			return rank;

		//not a leaf: proceed recursively

		return recursiveRank(c, rank, (bit==0?child0(node):child1(node)), level+1);

	}